

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

PointerType __thiscall capnp::_::PointerBuilder::getPointerType(PointerBuilder *this)

{
  bool bVar1;
  Kind KVar2;
  word *refTarget;
  Fault local_48;
  Fault f_1;
  DebugExpression<bool> _kjCondition;
  Fault local_30;
  Fault f;
  SegmentBuilder *sgmt;
  WirePointer *ptr;
  PointerBuilder *this_local;
  
  ptr = (WirePointer *)this;
  bVar1 = WirePointer::isNull(this->pointer);
  if (bVar1) {
    this_local._4_4_ = NULL_;
  }
  else {
    sgmt = (SegmentBuilder *)this->pointer;
    f.exception = (Exception *)this->segment;
    refTarget = WirePointer::target((WirePointer *)sgmt);
    WireHelpers::followFars((WirePointer **)&sgmt,refTarget,(SegmentBuilder **)&f);
    KVar2 = WirePointer::kind((WirePointer *)sgmt);
    switch(KVar2) {
    case STRUCT:
      this_local._4_4_ = STRUCT;
      break;
    case LIST:
      this_local._4_4_ = LIST;
      break;
    case FAR:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
                (&local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0xa58,FAILED,(char *)0x0,"\"far pointer not followed?\"",
                 (char (*) [26])"far pointer not followed?");
      kj::_::Debug::Fault::fatal(&local_30);
    case OTHER:
      f_1.exception._2_1_ = WirePointer::isCapability((WirePointer *)sgmt);
      f_1.exception._3_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                      (bool *)((long)&f_1.exception + 2));
      bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                        ((DebugExpression *)((long)&f_1.exception + 3));
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[21]>
                  (&local_48,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0xa5e,FAILED,"ptr->isCapability()","_kjCondition,\"unknown pointer type\"",
                   (DebugExpression<bool> *)((long)&f_1.exception + 3),
                   (char (*) [21])"unknown pointer type");
        kj::_::Debug::Fault::fatal(&local_48);
      }
      this_local._4_4_ = CAPABILITY;
      break;
    default:
      kj::_::unreachable();
    }
  }
  return this_local._4_4_;
}

Assistant:

PointerType PointerBuilder::getPointerType() const {
  if(pointer->isNull()) {
    return PointerType::NULL_;
  } else {
    WirePointer* ptr = pointer;
    SegmentBuilder* sgmt = segment;
    WireHelpers::followFars(ptr, ptr->target(), sgmt);
    switch(ptr->kind()) {
      case WirePointer::FAR:
        KJ_FAIL_ASSERT("far pointer not followed?");
      case WirePointer::STRUCT:
        return PointerType::STRUCT;
      case WirePointer::LIST:
        return PointerType::LIST;
      case WirePointer::OTHER:
        KJ_REQUIRE(ptr->isCapability(), "unknown pointer type");
        return PointerType::CAPABILITY;
    }
    KJ_UNREACHABLE;
  }
}